

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O0

bool __thiscall
iDynTree::SimpleLeggedOdometry::changeFixedFrame
          (SimpleLeggedOdometry *this,FrameIndex newFixedFrame,Transform *world_H_newFixedFrame)

{
  Transform *in_RDX;
  long in_RDI;
  Transform newFixedFrame_H_newFixedLink;
  LinkIndex newFixedLink;
  Transform local_148 [96];
  undefined1 local_e8 [192];
  long local_28;
  Transform *local_20;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x191) & 1) == 0) {
    iDynTree::reportError
              ("SimpleLeggedOdometry","changeFixedFrame",
               "changeFixedFrame was called, but the kinematics info was never setted.");
    local_1 = false;
  }
  else {
    local_20 = in_RDX;
    local_28 = iDynTree::Model::getFrameLink(in_RDI);
    if (local_28 == LINK_INVALID_INDEX) {
      iDynTree::reportError
                ("SimpleLeggedOdometry","changeFixedFrame",
                 "changeFixedFrame was called, but the provided new fixed frame is unknown.");
      local_1 = false;
    }
    else {
      iDynTree::Model::getFrameTransform((long)local_e8);
      iDynTree::Transform::inverse();
      iDynTree::Transform::operator*(local_148,local_20);
      iDynTree::Transform::operator=((Transform *)(in_RDI + 0x1b8),local_148);
      *(long *)(in_RDI + 0x198) = local_28;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool SimpleLeggedOdometry::changeFixedFrame(const FrameIndex newFixedFrame, const Transform & world_H_newFixedFrame)
{
    if( !this->m_kinematicsUpdated )
    {
        reportError("SimpleLeggedOdometry",
                    "changeFixedFrame",
                    "changeFixedFrame was called, but the kinematics info was never setted.");
        return false;
    }

    LinkIndex newFixedLink = this->m_model.getFrameLink(newFixedFrame);

    if( newFixedLink == LINK_INVALID_INDEX )
    {
        reportError("SimpleLeggedOdometry",
                    "changeFixedFrame",
                    "changeFixedFrame was called, but the provided new fixed frame is unknown.");
        return false;
    }

    Transform newFixedFrame_H_newFixedLink = m_model.getFrameTransform(newFixedFrame).inverse();
    this->m_world_H_fixedLink = world_H_newFixedFrame * newFixedFrame_H_newFixedLink;
    this->m_fixedLinkIndex = newFixedLink;

    return true;
}